

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_copy_rect8_16bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  v128 row;
  int j;
  int i;
  int height_local;
  int width_local;
  int sstride_local;
  uint16_t *src_local;
  int dstride_local;
  uint16_t *dst_local;
  
  for (row[1]._0_4_ = 0; (int)row[1] < height; row[1]._0_4_ = (int)row[1] + 1) {
    for (row[0]._4_4_ = 0; row[0]._4_4_ < (int)(width & 0xfffffff8U);
        row[0]._4_4_ = row[0]._4_4_ + 8) {
      auVar1 = vlddqu_avx(*(undefined1 (*) [16])(src + ((int)row[1] * sstride + row[0]._4_4_)));
      local_98 = auVar1._0_8_;
      uStack_90 = auVar1._8_8_;
      *(undefined8 *)(dst + ((int)row[1] * dstride + row[0]._4_4_)) = local_98;
      *(undefined8 *)(dst + ((int)row[1] * dstride + row[0]._4_4_) + 4) = uStack_90;
    }
    for (; row[0]._4_4_ < width; row[0]._4_4_ = row[0]._4_4_ + 1) {
      dst[(int)row[1] * dstride + row[0]._4_4_] = src[(int)row[1] * sstride + row[0]._4_4_];
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}